

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool qpTestLog_startImageSet(qpTestLog *log,char *name,char *description)

{
  deBool dVar1;
  long lVar2;
  undefined1 local_f0 [16];
  char *local_e0;
  char *local_d8;
  undefined1 local_d0 [16];
  char *local_c0;
  char *local_b8;
  int local_ac;
  undefined1 local_a8 [4];
  int numAttribs;
  qpXmlAttribute attribs [4];
  char *description_local;
  char *name_local;
  qpTestLog *log_local;
  
  local_ac = 0;
  attribs[3]._24_8_ = description;
  deMutex_lock(log->lock);
  lVar2 = (long)local_ac;
  local_ac = local_ac + 1;
  qpSetStringAttrib((qpXmlAttribute *)local_d0,"Name",name);
  *(undefined8 *)(local_a8 + lVar2 * 0x20) = local_d0._0_8_;
  attribs[lVar2].name = (char *)local_d0._8_8_;
  *(char **)&attribs[lVar2].type = local_c0;
  attribs[lVar2].stringValue = local_b8;
  if (attribs[3]._24_8_ != 0) {
    lVar2 = (long)local_ac;
    local_ac = local_ac + 1;
    qpSetStringAttrib((qpXmlAttribute *)local_f0,"Description",(char *)attribs[3]._24_8_);
    *(undefined8 *)(local_a8 + lVar2 * 0x20) = local_f0._0_8_;
    attribs[lVar2].name = (char *)local_f0._8_8_;
    *(char **)&attribs[lVar2].type = local_e0;
    attribs[lVar2].stringValue = local_d8;
  }
  dVar1 = qpXmlWriter_startElement(log->writer,"ImageSet",local_ac,(qpXmlAttribute *)local_a8);
  if (dVar1 != 0) {
    deMutex_unlock(log->lock);
  }
  else {
    qpPrintf("qpTestLog_startImageSet(): Writing XML failed\n");
    deMutex_unlock(log->lock);
  }
  log_local._4_4_ = (uint)(dVar1 != 0);
  return log_local._4_4_;
}

Assistant:

deBool qpTestLog_startImageSet (qpTestLog* log, const char* name, const char* description)
{
	qpXmlAttribute	attribs[4];
	int				numAttribs = 0;

	DE_ASSERT(log && name);
	deMutex_lock(log->lock);

	attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	if (description)
		attribs[numAttribs++] = qpSetStringAttrib("Description", description);

	/* <ImageSet Name="<name>"> */
	if (!qpXmlWriter_startElement(log->writer, "ImageSet", numAttribs, attribs))
	{
		qpPrintf("qpTestLog_startImageSet(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	DE_ASSERT(ContainerStack_push(&log->containerStack, CONTAINERTYPE_IMAGESET));

	deMutex_unlock(log->lock);
	return DE_TRUE;
}